

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

LatticeComparison __thiscall
wasm::analysis::Array<wasm::analysis::Bool,_2UL>::compare
          (Array<wasm::analysis::Bool,_2UL> *this,Element *a,Element *b)

{
  value_type_conflict vVar1;
  LatticeComparison LVar2;
  const_reference pvVar3;
  ulong local_38;
  size_t i;
  LatticeComparison result;
  Element *b_local;
  Element *a_local;
  Array<wasm::analysis::Bool,_2UL> *this_local;
  
  i._4_4_ = EQUAL;
  local_38 = 0;
  do {
    if (1 < local_38) {
      return i._4_4_;
    }
    pvVar3 = std::array<bool,_2UL>::operator[](a,local_38);
    vVar1 = *pvVar3;
    pvVar3 = std::array<bool,_2UL>::operator[](b,local_38);
    LVar2 = Bool::compare((Bool *)this,(Element)(vVar1 & 1),(Element)(*pvVar3 & 1));
    switch(LVar2) {
    case NO_RELATION:
      return NO_RELATION;
    case EQUAL:
      break;
    case LESS:
      if (i._4_4_ == GREATER) {
        return NO_RELATION;
      }
      i._4_4_ = LESS;
      break;
    case GREATER:
      if (i._4_4_ == LESS) {
        return NO_RELATION;
      }
      i._4_4_ = GREATER;
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

LatticeComparison compare(const Element& a, const Element& b) const noexcept {
    auto result = EQUAL;
    for (size_t i = 0; i < N; ++i) {
      switch (lattice.compare(a[i], b[i])) {
        case NO_RELATION:
          return NO_RELATION;
        case EQUAL:
          continue;
        case LESS:
          if (result == GREATER) {
            // Cannot be both less and greater.
            return NO_RELATION;
          }
          result = LESS;
          continue;
        case GREATER:
          if (result == LESS) {
            // Cannot be both greater and less.
            return NO_RELATION;
          }
          result = GREATER;
          continue;
      }
    }
    return result;
  }